

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O2

void blockencodings_tests::TransactionsRequestDeserializationMaxTest_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  char *local_678;
  char *local_670;
  pointer local_668;
  pointer local_660;
  char *local_658;
  char *local_650;
  basic_wrap_stringstream<char> local_648;
  TransactionsRequestDeserializationMaxTest t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_650 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"TransactionsRequestDeserializationMaxTest");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_668 = (pbVar3->_M_dataplus)._M_p;
  local_660 = local_668 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x17c;
  file.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_668,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  RegTestingSetup::RegTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_670 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"TransactionsRequestDeserializationMaxTest");
  std::operator<<((ostream *)&local_648,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_688 = (pbVar3->_M_dataplus)._M_p;
  local_680 = local_688 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x17c;
  file_00.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_688,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_690 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"TransactionsRequestDeserializationMaxTest");
  std::operator<<((ostream *)&local_648,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x17c;
  file_01.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6a8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  TransactionsRequestDeserializationMaxTest::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6b0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"TransactionsRequestDeserializationMaxTest");
  std::operator<<((ostream *)&local_648,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x17c;
  file_02.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6c8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6d0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"TransactionsRequestDeserializationMaxTest");
  std::operator<<((ostream *)&local_648,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x17c;
  file_03.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6e8,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestDeserializationMaxTest) {
    // Check that the highest legal index is decoded correctly
    BlockTransactionsRequest req0;
    req0.blockhash = m_rng.rand256();
    req0.indexes.resize(1);
    req0.indexes[0] = 0xffff;
    DataStream stream{};
    stream << req0;

    BlockTransactionsRequest req1;
    stream >> req1;
    BOOST_CHECK_EQUAL(req0.indexes.size(), req1.indexes.size());
    BOOST_CHECK_EQUAL(req0.indexes[0], req1.indexes[0]);
}